

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O1

void __thiscall
OpenMD::HydroIO::interpretHydroProp
          (HydroIO *this,HydroProp *hp,RealType viscosity,RealType temperature)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  double (*padVar7) [3];
  double (*padVar8) [3];
  uint i;
  uint i_1;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double (*padVar12) [3];
  double *__return_storage_ptr__;
  Vector3d ror;
  Vector3d cod;
  Mat3x3d Ddtr;
  Mat3x3d Xirtr;
  Mat3x3d Ddrr;
  Mat3x3d Ddtt;
  Mat3x3d Xidrr;
  Mat3x3d Xidtr;
  Mat3x3d Xidrt;
  Mat3x3d Xidtt;
  Mat3x3d Drrr;
  Mat3x3d Drtr;
  Mat3x3d Drrt;
  Mat3x3d Drtt;
  Mat3x3d Xirrr;
  Mat3x3d Xirtt;
  Mat6x6d Xid;
  Mat6x6d Dr;
  Mat6x6d Xi;
  SquareMatrix3<double> result_1;
  Mat6x6d Dd;
  Vector<double,_3U> local_9c8;
  Vector<double,_3U> local_9b0;
  RectMatrix<double,_3U,_3U> local_998;
  RectMatrix<double,_3U,_3U> local_948;
  RectMatrix<double,_3U,_3U> local_8f8;
  RectMatrix<double,_3U,_3U> local_8a8;
  RectMatrix<double,_3U,_3U> local_858;
  undefined1 local_808 [76];
  undefined1 auStack_7bc [4];
  RectMatrix<double,_3U,_3U> local_7b8;
  RectMatrix<double,_3U,_3U> local_768;
  RectMatrix<double,_3U,_3U> local_718;
  undefined1 local_6c8 [76];
  undefined1 auStack_67c [4];
  RectMatrix<double,_3U,_3U> local_678;
  RectMatrix<double,_3U,_3U> local_628;
  RectMatrix<double,_3U,_3U> local_5d8;
  RectMatrix<double,_3U,_3U> local_588;
  Mat6x6d local_538;
  undefined8 local_418 [18];
  undefined8 auStack_388 [18];
  Vector3d local_2f8;
  Vector3d local_2d8;
  undefined8 local_2b8 [18];
  undefined8 auStack_228 [18];
  RectMatrix<double,_3U,_3U> local_198;
  Mat6x6d local_150;
  
  local_9c8.data_[0] = 0.0;
  local_9c8.data_[1] = 0.0;
  local_9c8.data_[2] = 0.0;
  if (&(hp->cor_).super_Vector<double,_3U> != &local_9c8) {
    local_9c8.data_[2] = (hp->cor_).super_Vector<double,_3U>.data_[2];
    local_9c8.data_[0] = (hp->cor_).super_Vector<double,_3U>.data_[0];
    local_9c8.data_[1] = (hp->cor_).super_Vector<double,_3U>.data_[1];
  }
  lVar10 = 0;
  memset(local_2b8,0,0x120);
  memcpy(local_418,&hp->Xi_,0x120);
  do {
    uVar1 = *(undefined8 *)((long)local_418 + lVar10);
    uVar2 = *(undefined8 *)((long)local_418 + lVar10 + 8);
    uVar3 = *(undefined8 *)((long)local_418 + lVar10 + 0x10);
    uVar4 = *(undefined8 *)((long)local_418 + lVar10 + 0x18);
    uVar5 = *(undefined8 *)((long)local_418 + lVar10 + 0x28);
    *(undefined8 *)((long)local_2b8 + lVar10 + 0x20) =
         *(undefined8 *)((long)local_418 + lVar10 + 0x20);
    *(undefined8 *)((long)local_2b8 + lVar10 + 0x28) = uVar5;
    *(undefined8 *)((long)local_2b8 + lVar10 + 0x10) = uVar3;
    *(undefined8 *)((long)local_2b8 + lVar10 + 0x18) = uVar4;
    *(undefined8 *)((long)local_2b8 + lVar10) = uVar1;
    *(undefined8 *)((long)local_2b8 + lVar10 + 8) = uVar2;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0x120);
  lVar10 = 0;
  local_588.data_[2][2] = 0.0;
  local_588.data_[2][0] = 0.0;
  local_588.data_[2][1] = 0.0;
  local_588.data_[1][1] = 0.0;
  local_588.data_[1][2] = 0.0;
  local_588.data_[0][2] = 0.0;
  local_588.data_[1][0] = 0.0;
  local_588.data_[0][0] = 0.0;
  local_588.data_[0][1] = 0.0;
  local_948.data_[2][2] = 0.0;
  local_948.data_[2][0] = 0.0;
  local_948.data_[2][1] = 0.0;
  local_948.data_[1][1] = 0.0;
  local_948.data_[1][2] = 0.0;
  local_948.data_[0][2] = 0.0;
  local_948.data_[1][0] = 0.0;
  local_948.data_[0][0] = 0.0;
  local_948.data_[0][1] = 0.0;
  local_5d8.data_[2][2] = 0.0;
  local_5d8.data_[2][0] = 0.0;
  local_5d8.data_[2][1] = 0.0;
  local_5d8.data_[1][1] = 0.0;
  local_5d8.data_[1][2] = 0.0;
  local_5d8.data_[0][2] = 0.0;
  local_5d8.data_[1][0] = 0.0;
  local_5d8.data_[0][0] = 0.0;
  local_5d8.data_[0][1] = 0.0;
  do {
    *(undefined8 *)((long)local_588.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)((long)local_2b8 + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_2b8 + lVar10 * 2 + 8);
    *(undefined8 *)((long)local_588.data_[0] + lVar10) =
         *(undefined8 *)((long)local_2b8 + lVar10 * 2);
    *(undefined8 *)((long)local_588.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_948.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)((long)auStack_228 + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)((long)auStack_228 + lVar10 * 2 + 8);
    *(undefined8 *)((long)local_948.data_[0] + lVar10) =
         *(undefined8 *)((long)auStack_228 + lVar10 * 2);
    *(undefined8 *)((long)local_948.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_5d8.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)((long)auStack_228 + lVar10 * 2 + 0x28);
    uVar1 = *(undefined8 *)((long)auStack_228 + lVar10 * 2 + 0x20);
    *(undefined8 *)((long)local_5d8.data_[0] + lVar10) =
         *(undefined8 *)((long)auStack_228 + lVar10 * 2 + 0x18);
    *(undefined8 *)((long)local_5d8.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  memset(local_418,0,0x120);
  __return_storage_ptr__ = (double *)&local_538;
  HydroProp::getDiffusionTensor((Mat6x6d *)__return_storage_ptr__,hp,temperature);
  do {
    uVar1 = *(undefined8 *)((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10);
    uVar2 = *(undefined8 *)((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 8);
    uVar3 = *(undefined8 *)
             ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x10);
    uVar4 = *(undefined8 *)
             ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x18);
    uVar5 = *(undefined8 *)
             ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x28);
    *(undefined8 *)((long)local_418 + lVar10 + 0x20) =
         *(undefined8 *)((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x20);
    *(undefined8 *)((long)local_418 + lVar10 + 0x28) = uVar5;
    *(undefined8 *)((long)local_418 + lVar10 + 0x10) = uVar3;
    *(undefined8 *)((long)local_418 + lVar10 + 0x18) = uVar4;
    *(undefined8 *)((long)local_418 + lVar10) = uVar1;
    *(undefined8 *)((long)local_418 + lVar10 + 8) = uVar2;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0x120);
  lVar10 = 0;
  local_628.data_[2][2] = 0.0;
  local_628.data_[2][0] = 0.0;
  local_628.data_[2][1] = 0.0;
  local_628.data_[1][1] = 0.0;
  local_628.data_[1][2] = 0.0;
  local_628.data_[0][2] = 0.0;
  local_628.data_[1][0] = 0.0;
  local_628.data_[0][0] = 0.0;
  local_628.data_[0][1] = 0.0;
  local_678.data_[2][2] = 0.0;
  local_678.data_[2][0] = 0.0;
  local_678.data_[2][1] = 0.0;
  local_678.data_[1][1] = 0.0;
  local_678.data_[1][2] = 0.0;
  local_678.data_[0][2] = 0.0;
  local_678.data_[1][0] = 0.0;
  local_678.data_[0][0] = 0.0;
  local_678.data_[0][1] = 0.0;
  local_6c8._64_8_ = 0.0;
  local_6c8._48_8_ = 0.0;
  local_6c8._56_8_ = 0.0;
  local_6c8._32_8_ = 0.0;
  local_6c8._40_8_ = 0.0;
  local_6c8._16_8_ = 0.0;
  local_6c8._24_8_ = 0.0;
  local_6c8._0_8_ = 0.0;
  local_6c8._8_8_ = 0.0;
  local_718.data_[2][2] = 0.0;
  local_718.data_[2][0] = 0.0;
  local_718.data_[2][1] = 0.0;
  local_718.data_[1][1] = 0.0;
  local_718.data_[1][2] = 0.0;
  local_718.data_[0][2] = 0.0;
  local_718.data_[1][0] = 0.0;
  local_718.data_[0][0] = 0.0;
  local_718.data_[0][1] = 0.0;
  do {
    *(undefined8 *)((long)local_628.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)((long)local_418 + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_418 + lVar10 * 2 + 8);
    *(undefined8 *)((long)local_628.data_[0] + lVar10) =
         *(undefined8 *)((long)local_418 + lVar10 * 2);
    *(undefined8 *)((long)local_628.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0xc;
  do {
    *(undefined8 *)((long)local_678.data_[0] + lVar10 + 4) =
         *(undefined8 *)((long)local_418 + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_418 + lVar10 * 2 + 8);
    *(undefined8 *)(local_6c8 + lVar10 + 0x44) = *(undefined8 *)((long)local_418 + lVar10 * 2);
    *(undefined8 *)(auStack_67c + lVar10) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x54);
  lVar10 = 0;
  do {
    *(undefined8 *)(local_6c8 + lVar10 + 0x10) =
         *(undefined8 *)((long)auStack_388 + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)((long)auStack_388 + lVar10 * 2 + 8);
    *(undefined8 *)(local_6c8 + lVar10) = *(undefined8 *)((long)auStack_388 + lVar10 * 2);
    *(undefined8 *)(local_6c8 + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_718.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)((long)auStack_388 + lVar10 * 2 + 0x28);
    uVar1 = *(undefined8 *)((long)auStack_388 + lVar10 * 2 + 0x20);
    *(undefined8 *)((long)local_718.data_[0] + lVar10) =
         *(undefined8 *)((long)auStack_388 + lVar10 * 2 + 0x18);
    *(undefined8 *)((long)local_718.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"viscosity = ",0xc);
  poVar6 = std::ostream::_M_insert<double>(viscosity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," Poise",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"temperature = ",0xe);
  poVar6 = std::ostream::_M_insert<double>(temperature);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," K",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The centers are based on the elements generated by Hydro ",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"which have been placed in an .xyz or .stl file.",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"They are not based on the geometry in the .omd file.\n",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Center of resistance :",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_9c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resistance tensor at center of resistance\n",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation [kcal.fs/(mol.A^2)]:",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_588);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation-translation [kcal.fs/(mol.A.radian)]:",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  local_538.super_RectMatrix<double,_6U,_6U>.data_[1][0] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[1][1] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[0][4] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[0][5] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[0][2] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[0][3] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[0][0] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[0][1] = 0.0;
  local_538.super_RectMatrix<double,_6U,_6U>.data_[1][2] = 0.0;
  padVar7 = (double (*) [3])&local_948;
  lVar10 = 0;
  do {
    lVar11 = 0;
    pdVar9 = __return_storage_ptr__;
    do {
      *pdVar9 = (*(double (*) [3])*padVar7)[lVar11];
      lVar11 = lVar11 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar11 != 3);
    lVar10 = lVar10 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
    padVar7 = padVar7 + 1;
  } while (lVar10 != 3);
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&local_538);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation-rotation [kcal.fs/(mol.A.radian)]:",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_948);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation [kcal.fs/(mol.radian^2)]:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_5d8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Diffusion tensor at center of resistance\n",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation (A^2 / fs):",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_628);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation-translation (A.radian / fs):",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_678);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation-rotation (A.radian / fs):",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)local_6c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation (radian^2 / fs):",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_718);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  HydroProp::getCenterOfDiffusion((Vector3d *)&local_9b0,hp,temperature);
  local_2d8.super_Vector<double,_3U>.data_[0] = local_9b0.data_[0];
  local_2d8.super_Vector<double,_3U>.data_[1] = local_9b0.data_[1];
  local_2d8.super_Vector<double,_3U>.data_[2] = local_9b0.data_[2];
  HydroProp::getResistanceTensorAtPos(&local_538,hp,&local_2d8);
  lVar10 = 0;
  local_768.data_[2][2] = 0.0;
  local_768.data_[2][0] = 0.0;
  local_768.data_[2][1] = 0.0;
  local_768.data_[1][1] = 0.0;
  local_768.data_[1][2] = 0.0;
  local_768.data_[0][2] = 0.0;
  local_768.data_[1][0] = 0.0;
  local_768.data_[0][0] = 0.0;
  local_768.data_[0][1] = 0.0;
  local_7b8.data_[2][2] = 0.0;
  local_7b8.data_[2][0] = 0.0;
  local_7b8.data_[2][1] = 0.0;
  local_7b8.data_[1][1] = 0.0;
  local_7b8.data_[1][2] = 0.0;
  local_7b8.data_[0][2] = 0.0;
  local_7b8.data_[1][0] = 0.0;
  local_7b8.data_[0][0] = 0.0;
  local_7b8.data_[0][1] = 0.0;
  local_808._64_8_ = 0.0;
  local_808._48_8_ = 0.0;
  local_808._56_8_ = 0.0;
  local_808._32_8_ = 0.0;
  local_808._40_8_ = 0.0;
  local_808._16_8_ = 0.0;
  local_808._24_8_ = 0.0;
  local_808._0_8_ = 0.0;
  local_808._8_8_ = 0.0;
  local_858.data_[2][2] = 0.0;
  local_858.data_[2][0] = 0.0;
  local_858.data_[2][1] = 0.0;
  local_858.data_[1][1] = 0.0;
  local_858.data_[1][2] = 0.0;
  local_858.data_[0][2] = 0.0;
  local_858.data_[1][0] = 0.0;
  local_858.data_[0][0] = 0.0;
  local_858.data_[0][1] = 0.0;
  do {
    *(undefined8 *)((long)local_768.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)
          ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2 + 8);
    *(undefined8 *)((long)local_768.data_[0] + lVar10) =
         *(undefined8 *)((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2);
    *(undefined8 *)((long)local_768.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0xc;
  do {
    *(undefined8 *)((long)local_7b8.data_[0] + lVar10 + 4) =
         *(undefined8 *)
          ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2 + 8);
    *(undefined8 *)(local_808 + lVar10 + 0x44) =
         *(undefined8 *)((long)local_538.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2);
    *(undefined8 *)(auStack_7bc + lVar10) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x54);
  lVar10 = 0;
  do {
    *(undefined8 *)(local_808 + lVar10 + 0x10) =
         *(undefined8 *)((long)local_418 + lVar10 * 2 + -0x80);
    uVar1 = *(undefined8 *)((long)local_418 + lVar10 * 2 + -0x88);
    *(undefined8 *)(local_808 + lVar10) = *(undefined8 *)((long)local_418 + lVar10 * 2 + -0x90);
    *(undefined8 *)(local_808 + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_858.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)((long)local_418 + lVar10 * 2 + -0x68);
    uVar1 = *(undefined8 *)((long)local_418 + lVar10 * 2 + -0x70);
    *(undefined8 *)((long)local_858.data_[0] + lVar10) =
         *(undefined8 *)((long)local_418 + lVar10 * 2 + -0x78);
    *(undefined8 *)((long)local_858.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  local_2f8.super_Vector<double,_3U>.data_[0] = local_9b0.data_[0];
  local_2f8.super_Vector<double,_3U>.data_[1] = local_9b0.data_[1];
  local_2f8.super_Vector<double,_3U>.data_[2] = local_9b0.data_[2];
  HydroProp::getDiffusionTensorAtPos(&local_150,hp,&local_2f8,temperature);
  lVar10 = 0;
  local_8a8.data_[2][2] = 0.0;
  local_8a8.data_[2][0] = 0.0;
  local_8a8.data_[2][1] = 0.0;
  local_8a8.data_[1][1] = 0.0;
  local_8a8.data_[1][2] = 0.0;
  local_8a8.data_[0][2] = 0.0;
  local_8a8.data_[1][0] = 0.0;
  local_8a8.data_[0][0] = 0.0;
  local_8a8.data_[0][1] = 0.0;
  local_998.data_[2][2] = 0.0;
  local_998.data_[2][0] = 0.0;
  local_998.data_[2][1] = 0.0;
  local_998.data_[1][1] = 0.0;
  local_998.data_[1][2] = 0.0;
  local_998.data_[0][2] = 0.0;
  local_998.data_[1][0] = 0.0;
  local_998.data_[0][0] = 0.0;
  local_998.data_[0][1] = 0.0;
  local_8f8.data_[2][2] = 0.0;
  local_8f8.data_[2][0] = 0.0;
  local_8f8.data_[2][1] = 0.0;
  local_8f8.data_[1][1] = 0.0;
  local_8f8.data_[1][2] = 0.0;
  local_8f8.data_[0][2] = 0.0;
  local_8f8.data_[1][0] = 0.0;
  local_8f8.data_[0][0] = 0.0;
  local_8f8.data_[0][1] = 0.0;
  do {
    *(undefined8 *)((long)local_8a8.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)
          ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2 + 8);
    *(undefined8 *)((long)local_8a8.data_[0] + lVar10) =
         *(undefined8 *)((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 * 2);
    *(undefined8 *)((long)local_8a8.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_998.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)
          ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar10 * 2 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar10 * 2 + 8);
    *(undefined8 *)((long)local_998.data_[0] + lVar10) =
         *(undefined8 *)((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar10 * 2);
    *(undefined8 *)((long)local_998.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)local_8f8.data_[0] + lVar10 + 0x10) =
         *(undefined8 *)
          ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar10 * 2 + 0x28);
    uVar1 = *(undefined8 *)
             ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar10 * 2 + 0x20);
    *(undefined8 *)((long)local_8f8.data_[0] + lVar10) =
         *(undefined8 *)
          ((long)local_150.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar10 * 2 + 0x18);
    *(undefined8 *)((long)local_8f8.data_[0] + lVar10 + 8) = uVar1;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Center of diffusion: ",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_9b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Diffusion tensor at center of diffusion \n ",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation (A^2 / fs) :",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_8a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation-translation (A.radian / fs):",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  padVar8 = (double (*) [3])&local_198;
  local_198.data_[2][0] = 0.0;
  local_198.data_[2][1] = 0.0;
  local_198.data_[1][1] = 0.0;
  local_198.data_[1][2] = 0.0;
  local_198.data_[0][2] = 0.0;
  local_198.data_[1][0] = 0.0;
  local_198.data_[0][0] = 0.0;
  local_198.data_[0][1] = 0.0;
  local_198.data_[2][2] = 0.0;
  padVar7 = (double (*) [3])&local_998;
  lVar10 = 0;
  do {
    lVar11 = 0;
    padVar12 = padVar8;
    do {
      (*(double (*) [3])*padVar12)[0] = (*(double (*) [3])*padVar7)[lVar11];
      lVar11 = lVar11 + 1;
      padVar12 = padVar12 + 1;
    } while (lVar11 != 3);
    lVar10 = lVar10 + 1;
    padVar8 = (double (*) [3])(*padVar8 + 1);
    padVar7 = padVar7 + 1;
  } while (lVar10 != 3);
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_198);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation-rotation (A.radian / fs):",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_998);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation (radian^2 / fs):",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_8f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resistance tensor at center of diffusion \n ",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation [kcal.fs/(mol.A^2)]:",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_768);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation-translation [kcal.fs/(mol.A.radian)]:",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_7b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"translation-rotation [kcal.fs/(mol.A.radian)]:",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)local_808);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rotation [kcal.fs/(mol.radian^2)]:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  poVar6 = OpenMD::operator<<((ostream *)&std::cout,&local_858);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------\n\n",0x2b);
  return;
}

Assistant:

void HydroIO::interpretHydroProp(HydroProp* hp, RealType viscosity,
                                   RealType temperature) {
    Vector3d ror = hp->getCenterOfResistance();

    Mat6x6d Xi;
    Xi = hp->getResistanceTensor();
    Mat3x3d Xirtt;
    Mat3x3d Xirrt;
    Mat3x3d Xirtr;
    Mat3x3d Xirrr;

    Xi.getSubMatrix(0, 0, Xirtt);
    Xi.getSubMatrix(0, 3, Xirrt);
    Xi.getSubMatrix(3, 0, Xirtr);
    Xi.getSubMatrix(3, 3, Xirrr);

    Mat6x6d Dr;
    Dr = hp->getDiffusionTensor(temperature);

    Mat3x3d Drtt;
    Mat3x3d Drrt;
    Mat3x3d Drtr;
    Mat3x3d Drrr;

    Dr.getSubMatrix(0, 0, Drtt);
    Dr.getSubMatrix(0, 3, Drrt);
    Dr.getSubMatrix(3, 0, Drtr);
    Dr.getSubMatrix(3, 3, Drrr);

    std::cout << "\n";
    std::cout << "-----------------------------------------\n";
    std::cout << "viscosity = " << viscosity << " Poise" << std::endl;
    std::cout << "temperature = " << temperature << " K" << std::endl;
    std::cout << "-----------------------------------------\n";
    std::cout << "The centers are based on the elements generated by Hydro "
              << std::endl;
    std::cout << "which have been placed in an .xyz or .stl file." << std::endl;
    std::cout << "They are not based on the geometry in the .omd file.\n"
              << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Center of resistance :" << std::endl;
    std::cout << ror << "\n" << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Resistance tensor at center of resistance\n" << std::endl;
    std::cout << "translation [kcal.fs/(mol.A^2)]:" << std::endl;
    std::cout << Xirtt << std::endl;
    std::cout << "rotation-translation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xirtr.transpose() << std::endl;
    std::cout << "translation-rotation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xirtr << std::endl;
    std::cout << "rotation [kcal.fs/(mol.radian^2)]:" << std::endl;
    std::cout << Xirrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Diffusion tensor at center of resistance\n" << std::endl;
    std::cout << "translation (A^2 / fs):" << std::endl;
    std::cout << Drtt << std::endl;
    std::cout << "rotation-translation (A.radian / fs):" << std::endl;
    std::cout << Drrt << std::endl;
    std::cout << "translation-rotation (A.radian / fs):" << std::endl;
    std::cout << Drtr << std::endl;
    std::cout << "rotation (radian^2 / fs):" << std::endl;
    std::cout << Drrr << std::endl;
    std::cout << "-----------------------------------------\n\n";

    // calculate center of diffusion using the same arbitrary origin as above
    // (from the generated geometry file .xyz)

    Vector3d cod = hp->getCenterOfDiffusion(temperature);
    Mat6x6d Xid  = hp->getResistanceTensorAtPos(cod);

    Mat3x3d Xidtt;
    Mat3x3d Xidrt;
    Mat3x3d Xidtr;
    Mat3x3d Xidrr;

    Xid.getSubMatrix(0, 0, Xidtt);
    Xid.getSubMatrix(0, 3, Xidrt);
    Xid.getSubMatrix(3, 0, Xidtr);
    Xid.getSubMatrix(3, 3, Xidrr);

    // calculate Diffusion Tensor at center of diffusion
    Mat6x6d Dd = hp->getDiffusionTensorAtPos(cod, temperature);

    Mat3x3d Ddtt;
    Mat3x3d Ddtr;
    Mat3x3d Ddrt;
    Mat3x3d Ddrr;

    Dd.getSubMatrix(0, 0, Ddtt);
    Dd.getSubMatrix(0, 3, Ddrt);
    Dd.getSubMatrix(3, 0, Ddtr);
    Dd.getSubMatrix(3, 3, Ddrr);

    std::cout << "Center of diffusion: " << std::endl;
    std::cout << cod << "\n" << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Diffusion tensor at center of diffusion \n " << std::endl;
    std::cout << "translation (A^2 / fs) :" << std::endl;
    std::cout << Ddtt << std::endl;
    std::cout << "rotation-translation (A.radian / fs):" << std::endl;
    std::cout << Ddtr.transpose() << std::endl;
    std::cout << "translation-rotation (A.radian / fs):" << std::endl;
    std::cout << Ddtr << std::endl;
    std::cout << "rotation (radian^2 / fs):" << std::endl;
    std::cout << Ddrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Resistance tensor at center of diffusion \n " << std::endl;
    std::cout << "translation [kcal.fs/(mol.A^2)]:" << std::endl;
    std::cout << Xidtt << std::endl;
    std::cout << "rotation-translation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xidrt << std::endl;
    std::cout << "translation-rotation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xidtr << std::endl;
    std::cout << "rotation [kcal.fs/(mol.radian^2)]:" << std::endl;
    std::cout << Xidrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
  }